

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O3

void __thiscall FIX::SocketInitiator::doConnect(SocketInitiator *this,SessionID *s,Dictionary *d)

{
  undefined8 *puVar1;
  bool bVar2;
  int s_00;
  Session *pSVar3;
  long *plVar4;
  undefined8 *puVar5;
  SocketConnection *this_00;
  mapped_type *ppSVar6;
  ulong *puVar7;
  long *plVar8;
  _func_int **pp_Var9;
  uint uVar10;
  ulong uVar11;
  undefined8 uVar12;
  Log *pLVar13;
  short sourcePort;
  short port;
  uint local_1b4;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  UtcTimeStamp local_190;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  ulong *local_150;
  long local_148;
  ulong local_140;
  long lStack_138;
  socket_handle result;
  undefined4 uStack_12c;
  long local_128;
  _func_int *p_Stack_120;
  undefined4 uStack_118;
  undefined4 uStack_114;
  string sourceAddress;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string address;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  address._M_dataplus._M_p = (pointer)&address.field_2;
  address._M_string_length = 0;
  address.field_2._M_local_buf[0] = '\0';
  port = 0;
  sourceAddress._M_dataplus._M_p = (pointer)&sourceAddress.field_2;
  sourceAddress._M_string_length = 0;
  sourceAddress.field_2._M_local_buf[0] = '\0';
  sourcePort = 0;
  pSVar3 = Session::lookupSession(s);
  DateTime::nowUtc();
  local_190.super_DateTime._8_8_ = local_128;
  local_190.super_DateTime.m_time = (int64_t)p_Stack_120;
  local_190.super_DateTime._vptr_DateTime = (_func_int **)&PTR__DateTime_001ea8f0;
  bVar2 = TimeRange::isInRange(&pSVar3->m_sessionTime,&local_190);
  if (!bVar2) goto LAB_001b2c47;
  getHost(this,s,d,&address,&port,&sourceAddress,&sourcePort);
  std::operator+(&local_50,"Connecting to ",&address);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_1a0 = *puVar7;
    lStack_198 = plVar4[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar7;
    local_1b0 = (ulong *)*plVar4;
  }
  local_1a8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  uVar10 = (uint)(ushort)port;
  IntConvertor::convert_abi_cxx11_(&local_d0,(IntConvertor *)(ulong)uVar10,(signed_int)local_1a8);
  uVar11 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar11 = local_1a0;
  }
  if (uVar11 < local_d0._M_string_length + local_1a8) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar12 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_d0._M_string_length + local_1a8) goto LAB_001b27ab;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_1b0);
  }
  else {
LAB_001b27ab:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_d0._M_dataplus._M_p);
  }
  local_170 = &local_160;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_160 = *plVar4;
    uStack_158 = puVar5[3];
  }
  else {
    local_160 = *plVar4;
    local_170 = (long *)*puVar5;
  }
  local_168 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_170);
  local_b0 = &local_a0;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar4[3];
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b0,(ulong)sourceAddress._M_dataplus._M_p);
  local_90 = &local_80;
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar4[3];
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_140 = *puVar7;
    lStack_138 = plVar4[3];
    local_150 = &local_140;
  }
  else {
    local_140 = *puVar7;
    local_150 = (ulong *)*plVar4;
  }
  local_148 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  IntConvertor::convert_abi_cxx11_
            (&local_f0,(IntConvertor *)(ulong)(ushort)sourcePort,(signed_int)local_148);
  uVar11 = 0xf;
  if (local_150 != &local_140) {
    uVar11 = local_140;
  }
  local_1b4 = uVar10;
  if (uVar11 < local_f0._M_string_length + local_148) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar12 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar12 < local_f0._M_string_length + local_148) goto LAB_001b299c;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_150);
  }
  else {
LAB_001b299c:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_150,(ulong)local_f0._M_dataplus._M_p);
  }
  local_190.super_DateTime._vptr_DateTime = (_func_int **)&local_190.super_DateTime.m_time;
  puVar1 = puVar5 + 2;
  if ((int64_t *)*puVar5 == puVar1) {
    local_190.super_DateTime.m_time = *puVar1;
    uStack_178 = puVar5[3];
  }
  else {
    local_190.super_DateTime.m_time = *puVar1;
    local_190.super_DateTime._vptr_DateTime = (_func_int **)*puVar5;
  }
  local_190.super_DateTime._8_8_ = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_190);
  pLVar13 = &(pSVar3->m_state).super_Log;
  pp_Var9 = (_func_int **)(plVar4 + 2);
  if ((_func_int **)*plVar4 == pp_Var9) {
    p_Stack_120 = *pp_Var9;
    uStack_118 = (undefined4)plVar4[3];
    uStack_114 = *(undefined4 *)((long)plVar4 + 0x1c);
    _result = &p_Stack_120;
  }
  else {
    p_Stack_120 = *pp_Var9;
    _result = (_func_int **)*plVar4;
  }
  local_128 = plVar4[1];
  *plVar4 = (long)pp_Var9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  (*pLVar13->_vptr_Log[6])(pLVar13);
  if (_result != &p_Stack_120) {
    operator_delete(_result,(ulong)(p_Stack_120 + 1));
  }
  if (local_190.super_DateTime._vptr_DateTime != (_func_int **)&local_190.super_DateTime.m_time) {
    operator_delete(local_190.super_DateTime._vptr_DateTime,
                    (ulong)(local_190.super_DateTime.m_time + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  uVar10 = (uint)(short)local_1b4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  s_00 = SocketConnector::connect
                   (&this->m_connector,(int)&address,(sockaddr *)(ulong)uVar10,(uint)this->m_noDelay
                   );
  _result = (_func_int **)CONCAT44(uStack_12c,s_00);
  Initiator::setPending(&this->super_Initiator,s);
  this_00 = (SocketConnection *)operator_new(0x2180);
  SocketConnection::SocketConnection(this_00,this,s,s_00,&(this->m_connector).m_monitor);
  ppSVar6 = std::
            map<int,_FIX::SocketConnection_*,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketConnection_*>_>_>
            ::operator[](&this->m_pendingConnections,&result);
  *ppSVar6 = this_00;
LAB_001b2c47:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sourceAddress._M_dataplus._M_p != &sourceAddress.field_2) {
    operator_delete(sourceAddress._M_dataplus._M_p,
                    CONCAT71(sourceAddress.field_2._M_allocated_capacity._1_7_,
                             sourceAddress.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)address._M_dataplus._M_p != &address.field_2) {
    operator_delete(address._M_dataplus._M_p,
                    CONCAT71(address.field_2._M_allocated_capacity._1_7_,
                             address.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void SocketInitiator::doConnect( const SessionID& s, const Dictionary& d )
{
  try
  {
    std::string address;
    short port = 0;
    std::string sourceAddress;
    short sourcePort = 0;

    Session* session = Session::lookupSession( s );
    if( !session->isSessionTime(UtcTimeStamp()) ) return;

    Log* log = session->getLog();

    getHost( s, d, address, port, sourceAddress, sourcePort );

    log->onEvent( "Connecting to " + address + " on port " + IntConvertor::convert((unsigned short)port) + " (Source " + sourceAddress + ":" + IntConvertor::convert((unsigned short)sourcePort) + ")");
    socket_handle result = m_connector.connect( address, port, m_noDelay, m_sendBufSize, m_rcvBufSize, sourceAddress, sourcePort );
    setPending( s );

    m_pendingConnections[ result ] 
      = new SocketConnection( *this, s, result, &m_connector.getMonitor() );
  }
  catch ( std::exception& ) {}
}